

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_analyzeEntropy
                 (void *dstBuffer,size_t maxDstSize,int compressionLevel,void *srcBuffer,
                 size_t *fileSizes,uint nbFiles,void *dictBuffer,size_t dictBufferSize,
                 uint notificationLevel)

{
  byte *pbVar1;
  BYTE *pBVar2;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  U32 offset;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ZSTD_CDict *cdict;
  ZSTD_CCtx *cctx;
  void *dst;
  size_t sVar7;
  byte *pbVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  void *pvVar22;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar23 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  seqStore_t *seqStorePtr;
  offsetCount_t bestRepOffset [4];
  uint offcodeCount [31];
  uint matchLengthCount [53];
  short offcodeNCount [31];
  short litLengthNCount [36];
  uint litLengthCount [36];
  short matchLengthNCount [53];
  uint countLit [256];
  HUF_CElt hufTable [257];
  U32 wksp [1216];
  U32 repOffset [1024];
  undefined8 in_stack_ffffffffffffcd38;
  ZSTD_CCtx *pZVar33;
  undefined8 local_32a0;
  undefined8 local_3298;
  ulong auStack_3290 [3];
  size_t local_3278;
  void *local_3270;
  undefined4 local_3250;
  undefined4 local_324c;
  undefined4 local_3248;
  uint local_3238 [29];
  uint auStack_31c4 [59];
  short local_30d8 [32];
  short local_3098 [40];
  uint local_3048 [2];
  undefined8 uStack_3040;
  short local_2fb8 [56];
  uint local_2f48 [2];
  undefined8 uStack_2f40;
  undefined8 auStack_2f38 [124];
  undefined8 local_2b54;
  HUF_CElt local_2b48 [258];
  undefined1 local_2338 [168];
  void *local_2290;
  uint local_1038 [1026];
  
  uVar3 = (int)dictBufferSize + 0x20000;
  uVar14 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  if (nbFiles == 0) {
    uVar19 = 0;
  }
  else {
    uVar16 = 0;
    uVar19 = 0;
    do {
      uVar19 = uVar19 + fileSizes[uVar16];
      uVar16 = uVar16 + 1;
    } while (nbFiles != uVar16);
  }
  uVar21 = (ulong)(nbFiles + (nbFiles == 0));
  uVar16 = uVar19 / uVar21;
  local_3270 = srcBuffer;
  if ((uVar14 ^ 0x1f) == 0) {
    cctx = (ZSTD_CCtx *)0x0;
    dst = (void *)0x0;
    cdict = (ZSTD_CDict *)0x0;
    sVar7 = 0xffffffffffffffde;
  }
  else {
    lVar5 = 0;
    do {
      (local_2f48 + lVar5)[0] = 1;
      (local_2f48 + lVar5)[1] = 1;
      *(undefined8 *)((long)auStack_2f38 + (lVar5 + -2) * 4) = 0x100000001;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x100);
    uVar17 = (ulong)(0x20 - (uVar14 ^ 0x1f));
    uVar15 = uVar17 - 1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar15;
    auVar25._8_4_ = (int)uVar15;
    auVar25._0_8_ = uVar15;
    auVar25._12_4_ = (int)(uVar15 >> 0x20);
    auVar27 = pmovsxbq(in_XMM3,0x302);
    auVar29 = pmovsxbq(in_XMM4,0x100);
    uVar15 = 0;
    auVar25 = auVar25 ^ _DAT_00277800;
    auVar24 = pmovsxbq(auVar24,0x404);
    do {
      auVar31 = auVar29 ^ _DAT_00277800;
      iVar4 = auVar25._4_4_;
      if ((bool)(~(auVar31._4_4_ == iVar4 && auVar25._0_4_ < auVar31._0_4_ || iVar4 < auVar31._4_4_)
                & 1)) {
        *(undefined4 *)((long)local_3238 + uVar15) = 1;
      }
      if (auVar31._12_4_ <= auVar25._12_4_ &&
          (auVar31._12_4_ != auVar25._12_4_ || auVar31._8_4_ <= auVar25._8_4_)) {
        *(undefined4 *)((long)local_3238 + uVar15 + 4) = 1;
      }
      iVar32 = SUB164(auVar27 ^ _DAT_00277800,4);
      if (iVar32 <= iVar4 && (iVar32 != iVar4 || SUB164(auVar27 ^ _DAT_00277800,0) <= auVar25._0_4_)
         ) {
        *(undefined4 *)((long)local_3238 + uVar15 + 8) = 1;
        *(undefined4 *)((long)local_3238 + uVar15 + 0xc) = 1;
      }
      lVar5 = auVar24._0_8_;
      lVar6 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + lVar5;
      lVar18 = auVar24._8_8_;
      auVar29._8_8_ = lVar6 + lVar18;
      lVar6 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + lVar5;
      auVar27._8_8_ = lVar6 + lVar18;
      uVar15 = uVar15 + 0x10;
    } while ((uVar17 * 4 + 0xc & 0xfffffffffffffff0) != uVar15);
    auVar31 = pmovsxbq(auVar25,0x302);
    auVar28 = pmovsxbq(auVar27,0x100);
    lVar6 = 3;
    do {
      if (SUB164(auVar28 ^ _DAT_00277800,4) == -0x80000000 &&
          SUB164(auVar28 ^ _DAT_00277800,0) < -0x7fffffcb) {
        auStack_31c4[lVar6] = 1;
        auStack_31c4[lVar6 + 1] = 1;
      }
      if (SUB164(auVar31 ^ _DAT_00277800,4) == -0x80000000 &&
          SUB164(auVar31 ^ _DAT_00277800,0) < -0x7fffffcb) {
        auStack_31c4[lVar6 + 2] = 1;
        auStack_31c4[lVar6 + 3] = 1;
      }
      lVar26 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + lVar5;
      auVar28._8_8_ = lVar26 + lVar18;
      lVar26 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + lVar5;
      auVar31._8_8_ = lVar26 + lVar18;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x3b);
    lVar5 = 0;
    do {
      (local_3048 + lVar5)[0] = 1;
      (local_3048 + lVar5)[1] = 1;
      *(undefined8 *)((long)&uStack_3040 + lVar5 * 4) = 0x100000001;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x24);
    local_3278 = maxDstSize;
    memset(local_1038,0,0x1000);
    local_1038[8] = 1;
    local_1038[4] = 1;
    local_1038[1] = 1;
    local_3298 = 0;
    auStack_3290[0] = 0;
    auStack_3290[1] = 0;
    auStack_3290[2] = 0;
    if (compressionLevel == 0) {
      compressionLevel = 3;
    }
    uVar15 = uVar16;
    if (uVar19 < uVar21) {
      uVar15 = 0xffffffffffffffff;
    }
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)local_2338,compressionLevel,uVar15,dictBufferSize,
               ZSTD_cpm_unknown);
    local_2338._32_4_ = 0;
    local_2338._36_4_ = 0;
    local_2338._28_4_ = ZSTD_fast;
    local_3250 = 1;
    local_324c = 0;
    local_3248 = 0;
    memset((ZSTD_CCtx_params *)local_2338,0,0xd0);
    local_2338._32_4_ = 1;
    local_2338._4_4_ = local_2338._0_4_;
    local_2338._152_16_ = (undefined1  [16])0x0;
    local_2290 = (void *)0x0;
    customMem.opaque = (void *)0x0;
    customMem.customAlloc = (ZSTD_allocFunction)0x0;
    customMem.customFree = (ZSTD_freeFunction)0x0;
    cdict = ZSTD_createCDict_advanced2
                      (dictBuffer,dictBufferSize,ZSTD_dlm_byRef,ZSTD_dct_rawContent,
                       (ZSTD_CCtx_params *)local_2338,customMem);
    customMem_00.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffcd38;
    customMem_00.customAlloc = (ZSTD_allocFunction)uVar16;
    customMem_00.opaque = dstBuffer;
    cctx = ZSTD_createCCtx_advanced(customMem_00);
    dst = malloc(0x20000);
    if (dst == (void *)0x0 || (cctx == (ZSTD_CCtx *)0x0 || cdict == (ZSTD_CDict *)0x0)) {
      sVar7 = 0xffffffffffffffc0;
      if (notificationLevel != 0) {
        ZDICT_analyzeEntropy_cold_1();
      }
    }
    else {
      pZVar33 = cctx;
      if (nbFiles != 0) {
        iVar4 = 1 << ((byte)local_2338._0_4_ & 0x1f);
        if (0x1ffff < iVar4) {
          iVar4 = 0x20000;
        }
        uVar19 = (ulong)iVar4;
        local_32a0 = &cctx->seqStore;
        uVar16 = 0;
        lVar5 = 0;
        do {
          uVar21 = fileSizes[uVar16];
          if (uVar19 < fileSizes[uVar16]) {
            uVar21 = uVar19;
          }
          sVar7 = ZSTD_compressBegin_usingCDict_internal
                            (cctx,cdict,(ZSTD_frameParameters)ZEXT812(0),0xffffffffffffffff);
          if (sVar7 < 0xffffffffffffff89) {
            sVar7 = ZSTD_compressBlock_deprecated
                              (cctx,dst,0x20000,(void *)((long)local_3270 + lVar5),uVar21);
            cctx = pZVar33;
            pZVar33 = cctx;
            if (sVar7 < 0xffffffffffffff89) {
              if (sVar7 != 0) {
                pbVar8 = (cctx->seqStore).litStart;
                pbVar1 = (cctx->seqStore).lit;
                if (pbVar8 < pbVar1) {
                  do {
                    local_2f48[*pbVar8] = local_2f48[*pbVar8] + 1;
                    pbVar8 = pbVar8 + 1;
                  } while (pbVar8 != pbVar1);
                }
                uVar21 = (ulong)((long)(cctx->seqStore).sequences -
                                (long)(cctx->seqStore).sequencesStart) >> 3;
                ZSTD_seqToCodes(local_32a0);
                iVar4 = (int)uVar21;
                pZVar33 = cctx;
                if (iVar4 != 0) {
                  pBVar2 = (cctx->seqStore).ofCode;
                  uVar21 = uVar21 & 0xffffffff;
                  uVar15 = 0;
                  do {
                    local_3238[pBVar2[uVar15]] = local_3238[pBVar2[uVar15]] + 1;
                    uVar15 = uVar15 + 1;
                  } while (uVar21 != uVar15);
                  pBVar2 = (cctx->seqStore).mlCode;
                  uVar15 = 0;
                  do {
                    auStack_31c4[(ulong)pBVar2[uVar15] + 3] =
                         auStack_31c4[(ulong)pBVar2[uVar15] + 3] + 1;
                    uVar15 = uVar15 + 1;
                  } while (uVar21 != uVar15);
                  pBVar2 = (cctx->seqStore).llCode;
                  uVar15 = 0;
                  do {
                    local_3048[pBVar2[uVar15]] = local_3048[pBVar2[uVar15]] + 1;
                    uVar15 = uVar15 + 1;
                  } while (uVar21 != uVar15);
                  if (iVar4 != 1) {
                    uVar13 = local_32a0->sequencesStart->offBase - 3;
                    uVar3 = local_32a0->sequencesStart[1].offBase - 3;
                    uVar21 = (ulong)uVar13;
                    if (0x3ff < uVar13) {
                      uVar21 = 0;
                    }
                    if (0x3ff < uVar3) {
                      uVar3 = 0;
                    }
                    local_1038[uVar21] = local_1038[uVar21] + 3;
                    local_1038[uVar3] = local_1038[uVar3] + 1;
                  }
                }
              }
            }
            else if (2 < notificationLevel) {
              ZDICT_analyzeEntropy_cold_3();
              pZVar33 = cctx;
            }
          }
          else if (notificationLevel != 0) {
            cctx = pZVar33;
            ZDICT_analyzeEntropy_cold_2();
            pZVar33 = cctx;
          }
          lVar5 = lVar5 + fileSizes[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar16 != nbFiles);
      }
      cctx = pZVar33;
      if (3 < notificationLevel) {
        ZDICT_analyzeEntropy_cold_4();
        cctx = pZVar33;
      }
      sVar7 = HUF_buildCTable_wksp(local_2b48,local_2f48,0xff,0xb,local_2338,0x1300);
      if (sVar7 < 0xffffffffffffff89) {
        if (sVar7 == 8) {
          auVar25 = extraout_XMM0;
          if (1 < notificationLevel) {
            ZDICT_analyzeEntropy_cold_6();
            auVar25 = extraout_XMM0_00;
          }
          lVar5 = 0;
          auVar25 = pmovsxbq(auVar25,0x302);
          auVar24 = pmovsxbq(auVar24,0x100);
          do {
            auVar30._8_4_ = (int)lVar5;
            auVar30._0_8_ = lVar5;
            auVar30._12_4_ = (int)((ulong)lVar5 >> 0x20);
            auVar27 = (auVar30 | auVar24) ^ _DAT_00277800;
            if (auVar27._4_4_ == -0x80000000 && auVar27._0_4_ < -0x7fffff01) {
              local_2f48[lVar5 + 1] = 2;
              *(undefined4 *)((long)auStack_2f38 + (lVar5 + -2) * 4) = 2;
            }
            auVar27 = (auVar30 | auVar25) ^ _DAT_00277800;
            if (auVar27._4_4_ == -0x80000000 && auVar27._0_4_ < -0x7fffff01) {
              *(undefined4 *)((long)auStack_2f38 + (lVar5 + -1) * 4) = 2;
              *(undefined4 *)((long)auStack_2f38 + lVar5 * 4) = 2;
            }
            lVar5 = lVar5 + 4;
          } while (lVar5 != 0x100);
          local_2f48[0] = 4;
          local_2b54 = 0x100000001;
          sVar9 = HUF_buildCTable_wksp(local_2b48,local_2f48,0xff,0xb,local_2338,0x1300);
          sVar7 = 9;
          if (sVar9 != 9) {
            __assert_fail("maxNbBits==9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xc210,
                          "size_t ZDICT_analyzeEntropy(void *, size_t, int, const void *, const size_t *, unsigned int, const void *, size_t, unsigned int)"
                         );
          }
        }
        lVar5 = 1;
        do {
          uVar19 = (ulong)local_1038[lVar5];
          auStack_3290[2] = CONCAT44(local_1038[lVar5],(int)lVar5);
          lVar18 = 3;
          do {
            if ((uint)uVar19 <= *(uint *)((long)&local_32a0 + lVar18 * 8 + 4)) break;
            uVar16 = (&local_32a0)[lVar18];
            uVar19 = auStack_3290[lVar18 + -1];
            (&local_32a0)[lVar18] = uVar19;
            auStack_3290[lVar18 + -1] = uVar16;
            lVar18 = lVar18 + -1;
            uVar19 = uVar19 >> 0x20;
          } while (lVar18 != 0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x400);
        uVar19 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + local_3238[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
        sVar9 = FSE_normalizeCount(local_30d8,8,local_3238,(ulong)uVar3,uVar14,1);
        if (sVar9 < 0xffffffffffffff89) {
          lVar5 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + auStack_31c4[lVar5 + 3];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x35);
          sVar10 = FSE_normalizeCount(local_2fb8,9,auStack_31c4 + 3,(ulong)uVar14,0x34,1);
          if (sVar10 < 0xffffffffffffff89) {
            lVar5 = 0;
            auVar24 = (undefined1  [16])0x0;
            do {
              auVar23._0_4_ = auVar24._0_4_ + local_3048[lVar5];
              auVar23._4_4_ = auVar24._4_4_ + local_3048[lVar5 + 1];
              auVar23._8_4_ = auVar24._8_4_ + *(int *)((long)&uStack_3040 + lVar5 * 4);
              auVar23._12_4_ = auVar24._12_4_ + *(int *)((long)&uStack_3040 + lVar5 * 4 + 4);
              lVar5 = lVar5 + 4;
              auVar24 = auVar23;
            } while (lVar5 != 0x24);
            auVar24 = phaddd(auVar23,auVar23);
            auVar24 = phaddd(auVar24,auVar24);
            sVar11 = FSE_normalizeCount(local_3098,9,local_3048,(ulong)auVar24._0_4_,0x23,1);
            sVar20 = local_3278;
            if (sVar11 < 0xffffffffffffff89) {
              sVar12 = HUF_writeCTable_wksp
                                 (dstBuffer,local_3278,local_2b48,0xff,(uint)sVar7,local_2338,0x1300
                                 );
              if (sVar12 < 0xffffffffffffff89) {
                sVar9 = FSE_writeNCount((void *)((long)dstBuffer + sVar12),sVar20 - sVar12,
                                        local_30d8,0x1e,(uint)sVar9);
                if (sVar9 < 0xffffffffffffff89) {
                  pvVar22 = (void *)((long)((long)dstBuffer + sVar12) + sVar9);
                  sVar20 = (sVar20 - sVar12) - sVar9;
                  sVar10 = FSE_writeNCount(pvVar22,sVar20,local_2fb8,0x34,(uint)sVar10);
                  if (sVar10 < 0xffffffffffffff89) {
                    pvVar22 = (void *)((long)pvVar22 + sVar10);
                    sVar20 = sVar20 - sVar10;
                    sVar7 = FSE_writeNCount(pvVar22,sVar20,local_3098,0x23,(uint)sVar11);
                    if (sVar7 < 0xffffffffffffff89) {
                      if (sVar20 - sVar7 < 0xc) {
                        sVar7 = 0xffffffffffffffba;
                        if (notificationLevel != 0) {
                          ZDICT_analyzeEntropy_cold_14();
                        }
                      }
                      else {
                        *(undefined8 *)((long)pvVar22 + sVar7) = 0x400000001;
                        *(undefined4 *)((long)pvVar22 + sVar7 + 8) = 8;
                        sVar7 = sVar12 + sVar9 + sVar10 + sVar7 + 0xc;
                      }
                    }
                    else if (notificationLevel != 0) {
                      ZDICT_analyzeEntropy_cold_13();
                    }
                  }
                  else {
                    sVar7 = sVar10;
                    if (notificationLevel != 0) {
                      ZDICT_analyzeEntropy_cold_12();
                    }
                  }
                }
                else {
                  sVar7 = sVar9;
                  if (notificationLevel != 0) {
                    ZDICT_analyzeEntropy_cold_11();
                  }
                }
              }
              else {
                sVar7 = sVar12;
                if (notificationLevel != 0) {
                  ZDICT_analyzeEntropy_cold_10();
                }
              }
            }
            else {
              sVar7 = sVar11;
              if (notificationLevel != 0) {
                ZDICT_analyzeEntropy_cold_9();
              }
            }
          }
          else {
            sVar7 = sVar10;
            if (notificationLevel != 0) {
              ZDICT_analyzeEntropy_cold_8();
            }
          }
        }
        else {
          sVar7 = sVar9;
          if (notificationLevel != 0) {
            ZDICT_analyzeEntropy_cold_7();
          }
        }
      }
      else if (notificationLevel != 0) {
        ZDICT_analyzeEntropy_cold_5();
      }
    }
  }
  ZSTD_freeCDict(cdict);
  ZSTD_freeCCtx(cctx);
  free(dst);
  return sVar7;
}

Assistant:

static size_t ZDICT_analyzeEntropy(void*  dstBuffer, size_t maxDstSize,
                                   int compressionLevel,
                             const void*  srcBuffer, const size_t* fileSizes, unsigned nbFiles,
                             const void* dictBuffer, size_t  dictBufferSize,
                                   unsigned notificationLevel)
{
    unsigned countLit[256];
    HUF_CREATE_STATIC_CTABLE(hufTable, 255);
    unsigned offcodeCount[OFFCODE_MAX+1];
    short offcodeNCount[OFFCODE_MAX+1];
    U32 offcodeMax = ZSTD_highbit32((U32)(dictBufferSize + 128 KB));
    unsigned matchLengthCount[MaxML+1];
    short matchLengthNCount[MaxML+1];
    unsigned litLengthCount[MaxLL+1];
    short litLengthNCount[MaxLL+1];
    U32 repOffset[MAXREPOFFSET];
    offsetCount_t bestRepOffset[ZSTD_REP_NUM+1];
    EStats_ress_t esr = { NULL, NULL, NULL };
    ZSTD_parameters params;
    U32 u, huffLog = 11, Offlog = OffFSELog, mlLog = MLFSELog, llLog = LLFSELog, total;
    size_t pos = 0, errorCode;
    size_t eSize = 0;
    size_t const totalSrcSize = ZDICT_totalSampleSize(fileSizes, nbFiles);
    size_t const averageSampleSize = totalSrcSize / (nbFiles + !nbFiles);
    BYTE* dstPtr = (BYTE*)dstBuffer;
    U32 wksp[HUF_CTABLE_WORKSPACE_SIZE_U32];

    /* init */
    DEBUGLOG(4, "ZDICT_analyzeEntropy");
    if (offcodeMax>OFFCODE_MAX) { eSize = ERROR(dictionaryCreation_failed); goto _cleanup; }   /* too large dictionary */
    for (u=0; u<256; u++) countLit[u] = 1;   /* any character must be described */
    for (u=0; u<=offcodeMax; u++) offcodeCount[u] = 1;
    for (u=0; u<=MaxML; u++) matchLengthCount[u] = 1;
    for (u=0; u<=MaxLL; u++) litLengthCount[u] = 1;
    memset(repOffset, 0, sizeof(repOffset));
    repOffset[1] = repOffset[4] = repOffset[8] = 1;
    memset(bestRepOffset, 0, sizeof(bestRepOffset));
    if (compressionLevel==0) compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params = ZSTD_getParams(compressionLevel, averageSampleSize, dictBufferSize);

    esr.dict = ZSTD_createCDict_advanced(dictBuffer, dictBufferSize, ZSTD_dlm_byRef, ZSTD_dct_rawContent, params.cParams, ZSTD_defaultCMem);
    esr.zc = ZSTD_createCCtx();
    esr.workPlace = malloc(ZSTD_BLOCKSIZE_MAX);
    if (!esr.dict || !esr.zc || !esr.workPlace) {
        eSize = ERROR(memory_allocation);
        DISPLAYLEVEL(1, "Not enough memory \n");
        goto _cleanup;
    }

    /* collect stats on all samples */
    for (u=0; u<nbFiles; u++) {
        ZDICT_countEStats(esr, &params,
                          countLit, offcodeCount, matchLengthCount, litLengthCount, repOffset,
                         (const char*)srcBuffer + pos, fileSizes[u],
                          notificationLevel);
        pos += fileSizes[u];
    }

    if (notificationLevel >= 4) {
        /* writeStats */
        DISPLAYLEVEL(4, "Offset Code Frequencies : \n");
        for (u=0; u<=offcodeMax; u++) {
            DISPLAYLEVEL(4, "%2u :%7u \n", u, offcodeCount[u]);
    }   }

    /* analyze, build stats, starting with literals */
    {   size_t maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(maxNbBits)) {
            eSize = maxNbBits;
            DISPLAYLEVEL(1, " HUF_buildCTable error \n");
            goto _cleanup;
        }
        if (maxNbBits==8) {  /* not compressible : will fail on HUF_writeCTable() */
            DISPLAYLEVEL(2, "warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n");
            ZDICT_flatLit(countLit);  /* replace distribution by a fake "mostly flat but still compressible" distribution, that HUF_writeCTable() can encode */
            maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
            assert(maxNbBits==9);
        }
        huffLog = (U32)maxNbBits;
    }

    /* looking for most common first offsets */
    {   U32 offset;
        for (offset=1; offset<MAXREPOFFSET; offset++)
            ZDICT_insertSortCount(bestRepOffset, offset, repOffset[offset]);
    }
    /* note : the result of this phase should be used to better appreciate the impact on statistics */

    total=0; for (u=0; u<=offcodeMax; u++) total+=offcodeCount[u];
    errorCode = FSE_normalizeCount(offcodeNCount, Offlog, offcodeCount, total, offcodeMax, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with offcodeCount \n");
        goto _cleanup;
    }
    Offlog = (U32)errorCode;

    total=0; for (u=0; u<=MaxML; u++) total+=matchLengthCount[u];
    errorCode = FSE_normalizeCount(matchLengthNCount, mlLog, matchLengthCount, total, MaxML, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with matchLengthCount \n");
        goto _cleanup;
    }
    mlLog = (U32)errorCode;

    total=0; for (u=0; u<=MaxLL; u++) total+=litLengthCount[u];
    errorCode = FSE_normalizeCount(litLengthNCount, llLog, litLengthCount, total, MaxLL, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with litLengthCount \n");
        goto _cleanup;
    }
    llLog = (U32)errorCode;

    /* write result to buffer */
    {   size_t const hhSize = HUF_writeCTable_wksp(dstPtr, maxDstSize, hufTable, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(hhSize)) {
            eSize = hhSize;
            DISPLAYLEVEL(1, "HUF_writeCTable error \n");
            goto _cleanup;
        }
        dstPtr += hhSize;
        maxDstSize -= hhSize;
        eSize += hhSize;
    }

    {   size_t const ohSize = FSE_writeNCount(dstPtr, maxDstSize, offcodeNCount, OFFCODE_MAX, Offlog);
        if (FSE_isError(ohSize)) {
            eSize = ohSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with offcodeNCount \n");
            goto _cleanup;
        }
        dstPtr += ohSize;
        maxDstSize -= ohSize;
        eSize += ohSize;
    }

    {   size_t const mhSize = FSE_writeNCount(dstPtr, maxDstSize, matchLengthNCount, MaxML, mlLog);
        if (FSE_isError(mhSize)) {
            eSize = mhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with matchLengthNCount \n");
            goto _cleanup;
        }
        dstPtr += mhSize;
        maxDstSize -= mhSize;
        eSize += mhSize;
    }

    {   size_t const lhSize = FSE_writeNCount(dstPtr, maxDstSize, litLengthNCount, MaxLL, llLog);
        if (FSE_isError(lhSize)) {
            eSize = lhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with litlengthNCount \n");
            goto _cleanup;
        }
        dstPtr += lhSize;
        maxDstSize -= lhSize;
        eSize += lhSize;
    }

    if (maxDstSize<12) {
        eSize = ERROR(dstSize_tooSmall);
        DISPLAYLEVEL(1, "not enough space to write RepOffsets \n");
        goto _cleanup;
    }
# if 0
    MEM_writeLE32(dstPtr+0, bestRepOffset[0].offset);
    MEM_writeLE32(dstPtr+4, bestRepOffset[1].offset);
    MEM_writeLE32(dstPtr+8, bestRepOffset[2].offset);
#else
    /* at this stage, we don't use the result of "most common first offset",
     * as the impact of statistics is not properly evaluated */
    MEM_writeLE32(dstPtr+0, repStartValue[0]);
    MEM_writeLE32(dstPtr+4, repStartValue[1]);
    MEM_writeLE32(dstPtr+8, repStartValue[2]);
#endif
    eSize += 12;

_cleanup:
    ZSTD_freeCDict(esr.dict);
    ZSTD_freeCCtx(esr.zc);
    free(esr.workPlace);

    return eSize;
}